

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cbtQuantizedBvh.h
# Opt level: O2

void __thiscall
cbtQuantizedBvh::quantize(cbtQuantizedBvh *this,unsigned_short *out,cbtVector3 *point,int isMax)

{
  undefined1 auVar1 [16];
  ushort uVar2;
  undefined1 auVar3 [16];
  undefined4 uVar4;
  undefined1 auVar5 [16];
  undefined1 in_ZMM0 [64];
  undefined1 auVar8 [56];
  undefined1 auVar6 [64];
  undefined1 auVar7 [64];
  undefined1 in_ZMM1 [64];
  undefined1 auVar10 [56];
  undefined1 auVar9 [64];
  undefined1 auVar11 [16];
  undefined1 auVar12 [16];
  cbtVector3 cVar13;
  cbtVector3 local_28;
  
  auVar10 = in_ZMM1._8_56_;
  auVar8 = in_ZMM0._8_56_;
  cVar13 = ::operator-(point,&this->m_bvhAabbMin);
  auVar9._0_8_ = cVar13.m_floats._8_8_;
  auVar9._8_56_ = auVar10;
  auVar6._0_8_ = cVar13.m_floats._0_8_;
  auVar6._8_56_ = auVar8;
  local_28.m_floats = (cbtScalar  [4])vmovlhps_avx(auVar6._0_16_,auVar9._0_16_);
  auVar8 = ZEXT856(local_28.m_floats._8_8_);
  cVar13 = ::operator*(&local_28,&this->m_bvhQuantization);
  auVar7._0_8_ = cVar13.m_floats._0_8_;
  auVar7._8_56_ = auVar8;
  if (isMax == 0) {
    auVar12._8_2_ = 0xfffe;
    auVar12._0_8_ = 0xfffefffefffefffe;
    auVar12._10_2_ = 0xfffe;
    auVar12._12_2_ = 0xfffe;
    auVar12._14_2_ = 0xfffe;
    auVar3._0_4_ = (int)cVar13.m_floats[0];
    auVar3._4_4_ = (int)cVar13.m_floats[1];
    auVar3._8_4_ = (int)auVar8._0_4_;
    auVar3._12_4_ = (int)auVar8._4_4_;
    auVar3 = vpackusdw_avx(auVar3,auVar3);
    uVar2 = (ushort)(int)cVar13.m_floats[2] & 0xfffe;
    auVar3 = vpand_avx(auVar3,auVar12);
    uVar4 = auVar3._0_4_;
  }
  else {
    auVar1._8_4_ = 0x3f800000;
    auVar1._0_8_ = 0x3f8000003f800000;
    auVar1._12_4_ = 0x3f800000;
    auVar3 = vaddps_avx512vl(auVar7._0_16_,auVar1);
    auVar11._8_2_ = 1;
    auVar11._0_8_ = 0x1000100010001;
    auVar11._10_2_ = 1;
    auVar11._12_2_ = 1;
    auVar11._14_2_ = 1;
    auVar5._0_4_ = (int)auVar3._0_4_;
    auVar5._4_4_ = (int)auVar3._4_4_;
    auVar5._8_4_ = (int)auVar3._8_4_;
    auVar5._12_4_ = (int)auVar3._12_4_;
    auVar3 = vpackusdw_avx(auVar5,auVar5);
    auVar3 = vpor_avx(auVar3,auVar11);
    uVar4 = auVar3._0_4_;
    uVar2 = (ushort)(int)(cVar13.m_floats[2] + 1.0) | 1;
  }
  *(undefined4 *)out = uVar4;
  out[2] = uVar2;
  return;
}

Assistant:

SIMD_FORCE_INLINE void quantize(unsigned short* out, const cbtVector3& point, int isMax) const
	{
		cbtAssert(m_useQuantization);

		cbtAssert(point.getX() <= m_bvhAabbMax.getX());
		cbtAssert(point.getY() <= m_bvhAabbMax.getY());
		cbtAssert(point.getZ() <= m_bvhAabbMax.getZ());

		cbtAssert(point.getX() >= m_bvhAabbMin.getX());
		cbtAssert(point.getY() >= m_bvhAabbMin.getY());
		cbtAssert(point.getZ() >= m_bvhAabbMin.getZ());

		cbtVector3 v = (point - m_bvhAabbMin) * m_bvhQuantization;
		///Make sure rounding is done in a way that unQuantize(quantizeWithClamp(...)) is conservative
		///end-points always set the first bit, so that they are sorted properly (so that neighbouring AABBs overlap properly)
		///@todo: double-check this
		if (isMax)
		{
			out[0] = (unsigned short)(((unsigned short)(v.getX() + cbtScalar(1.)) | 1));
			out[1] = (unsigned short)(((unsigned short)(v.getY() + cbtScalar(1.)) | 1));
			out[2] = (unsigned short)(((unsigned short)(v.getZ() + cbtScalar(1.)) | 1));
		}
		else
		{
			out[0] = (unsigned short)(((unsigned short)(v.getX()) & 0xfffe));
			out[1] = (unsigned short)(((unsigned short)(v.getY()) & 0xfffe));
			out[2] = (unsigned short)(((unsigned short)(v.getZ()) & 0xfffe));
		}

#ifdef DEBUG_CHECK_DEQUANTIZATION
		cbtVector3 newPoint = unQuantize(out);
		if (isMax)
		{
			if (newPoint.getX() < point.getX())
			{
				printf("unconservative X, diffX = %f, oldX=%f,newX=%f\n", newPoint.getX() - point.getX(), newPoint.getX(), point.getX());
			}
			if (newPoint.getY() < point.getY())
			{
				printf("unconservative Y, diffY = %f, oldY=%f,newY=%f\n", newPoint.getY() - point.getY(), newPoint.getY(), point.getY());
			}
			if (newPoint.getZ() < point.getZ())
			{
				printf("unconservative Z, diffZ = %f, oldZ=%f,newZ=%f\n", newPoint.getZ() - point.getZ(), newPoint.getZ(), point.getZ());
			}
		}
		else
		{
			if (newPoint.getX() > point.getX())
			{
				printf("unconservative X, diffX = %f, oldX=%f,newX=%f\n", newPoint.getX() - point.getX(), newPoint.getX(), point.getX());
			}
			if (newPoint.getY() > point.getY())
			{
				printf("unconservative Y, diffY = %f, oldY=%f,newY=%f\n", newPoint.getY() - point.getY(), newPoint.getY(), point.getY());
			}
			if (newPoint.getZ() > point.getZ())
			{
				printf("unconservative Z, diffZ = %f, oldZ=%f,newZ=%f\n", newPoint.getZ() - point.getZ(), newPoint.getZ(), point.getZ());
			}
		}
#endif  //DEBUG_CHECK_DEQUANTIZATION
	}